

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::LoadRevisions(cmCTestSVN *this,SVNInfo *svninfo)

{
  undefined1 *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined1 local_2f8 [8];
  OutputLogger err;
  LogParser out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  svn_log;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string revs;
  SVNInfo *svninfo_local;
  cmCTestSVN *this_local;
  
  revs.field_2._8_8_ = svninfo;
  std::__cxx11::string::string((string *)local_38);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(pcVar4);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = atoi(pcVar4);
  if (iVar2 < iVar3) {
    std::operator+(&local_98,"-r",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (revs.field_2._8_8_ + 0x80));
    std::operator+(&local_78,&local_98,":");
    std::operator+(&local_58,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (revs.field_2._8_8_ + 0xa0));
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &svn_log.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"-r",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (revs.field_2._8_8_ + 0xa0));
    std::__cxx11::string::operator=
              ((string *)local_38,
               (string *)
               &svn_log.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &svn_log.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  this_00 = &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [4])0x126be46);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             (char (*) [6])"--xml");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             (char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)revs.field_2._8_8_
            );
  LogParser::LogParser
            ((LogParser *)&err.super_LineParser.Separator,this,"log-out> ",
             (SVNInfo *)revs.field_2._8_8_);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_2f8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> "
            );
  bVar1 = RunSVNCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 field_0x10,(OutputParser *)&err.super_LineParser.Separator,
                        (OutputParser *)local_2f8);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_2f8);
  LogParser::~LogParser((LogParser *)&err.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool cmCTestSVN::LoadRevisions(SVNInfo& svninfo)
{
  // We are interested in every revision included in the update.
  std::string revs;
  if (atoi(svninfo.OldRevision.c_str()) < atoi(svninfo.NewRevision.c_str())) {
    revs = "-r" + svninfo.OldRevision + ":" + svninfo.NewRevision;
  } else {
    revs = "-r" + svninfo.NewRevision;
  }

  // Run "svn log" to get all global revisions of interest.
  std::vector<std::string> svn_log;
  svn_log.emplace_back("log");
  svn_log.emplace_back("--xml");
  svn_log.emplace_back("-v");
  svn_log.emplace_back(revs);
  svn_log.emplace_back(svninfo.LocalPath);
  LogParser out(this, "log-out> ", svninfo);
  OutputLogger err(this->Log, "log-err> ");
  return this->RunSVNCommand(svn_log, &out, &err);
}